

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

xmlParserNodeInfo * xmlParserFindNodeInfo(xmlParserCtxtPtr ctx,xmlNodePtr node)

{
  unsigned_long uVar1;
  xmlParserNodeInfo *pxVar2;
  
  if (node == (xmlNodePtr)0x0 || ctx == (xmlParserCtxtPtr)0x0) {
    return (xmlParserNodeInfo *)0x0;
  }
  uVar1 = xmlParserFindNodeInfoIndex(&ctx->node_seq,node);
  if ((uVar1 < (ctx->node_seq).length) &&
     (pxVar2 = (ctx->node_seq).buffer, pxVar2[uVar1].node == node)) {
    pxVar2 = pxVar2 + uVar1;
  }
  else {
    pxVar2 = (xmlParserNodeInfo *)0x0;
  }
  return pxVar2;
}

Assistant:

const xmlParserNodeInfo *
xmlParserFindNodeInfo(xmlParserCtxtPtr ctx, xmlNodePtr node)
{
    unsigned long pos;

    if ((ctx == NULL) || (node == NULL))
        return (NULL);
    /* Find position where node should be at */
    pos = xmlParserFindNodeInfoIndex(&ctx->node_seq, node);
    if (pos < ctx->node_seq.length
        && ctx->node_seq.buffer[pos].node == node)
        return &ctx->node_seq.buffer[pos];
    else
        return NULL;
}